

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall google::LogMessage::SendToLog(LogMessage *this)

{
  char cVar1;
  int iVar2;
  int32 iVar3;
  ulong uVar4;
  time_t tVar5;
  long *plVar6;
  LogMessage *pLVar7;
  bool bVar8;
  int iVar9;
  LogDestination *this_00;
  size_t sVar10;
  int i;
  long lVar11;
  LogMessageData *pLVar12;
  LogSeverity severity;
  ulong uVar13;
  ReaderMutexLock local_50;
  char *local_48;
  char *local_40;
  LogMessage *local_38;
  
  if ((SendToLog()::already_warned_before_initgoogle == '\0') &&
     (bVar8 = glog_internal_namespace_::IsGoogleLoggingInitialized(), !bVar8)) {
    SendToLog();
  }
  local_38 = this;
  if ((fLB::FLAGS_logtostderr == '\0') &&
     (bVar8 = glog_internal_namespace_::IsGoogleLoggingInitialized(), bVar8)) {
    pLVar12 = this->data_;
    cVar1 = pLVar12->severity_;
    uVar4 = pLVar12->num_chars_to_log_;
    if (fLB::FLAGS_logtostderr == '\0') {
      if (-1 < cVar1) {
        tVar5 = pLVar12->timestamp_;
        uVar13 = (ulong)(uint)(int)cVar1;
        do {
          lVar11 = (long)fLI::FLAGS_logbuflevel;
          this_00 = (LogDestination *)(&LogDestination::log_destinations_)[uVar13];
          if (this_00 == (LogDestination *)0x0) {
            this_00 = (LogDestination *)operator_new(0xe0);
            LogDestination::LogDestination(this_00,(LogSeverity)uVar13,(char *)0x0);
            (&LogDestination::log_destinations_)[uVar13] = this_00;
          }
          (*this_00->logger_->_vptr_Logger[2])
                    (this_00->logger_,(ulong)(lVar11 < (long)uVar13),tVar5,pLVar12->message_text_,
                     uVar4 & 0xffffffff);
          bVar8 = 0 < (long)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar8);
      }
    }
    else {
      ColoredWriteToStderr((int)cVar1,pLVar12->message_text_,uVar4);
    }
    pLVar7 = local_38;
    pLVar12 = local_38->data_;
    severity = (LogSeverity)pLVar12->severity_;
    sVar10 = pLVar12->num_chars_to_log_;
    if ((fLI::FLAGS_stderrthreshold <= severity) || (fLB::FLAGS_alsologtostderr == '\x01')) {
      ColoredWriteToStderr(severity,pLVar12->message_text_,sVar10);
      pLVar12 = pLVar7->data_;
      severity = (LogSeverity)pLVar12->severity_;
      sVar10 = pLVar12->num_chars_to_log_;
    }
    LogDestination::MaybeLogToEmail(severity,pLVar12->message_text_,sVar10);
    pLVar12 = pLVar7->data_;
    cVar1 = pLVar12->severity_;
    local_40 = pLVar12->fullname_;
    local_48 = pLVar12->basename_;
    iVar2 = pLVar12->line_;
    iVar3 = pLVar12->usecs_;
    uVar4 = pLVar12->num_prefix_chars_;
    sVar10 = pLVar12->num_chars_to_log_;
    local_50.mu_ = (Mutex *)LogDestination::sink_mutex_;
    if ((LogDestination::sink_mutex_[0x38] == '\x01') &&
       (iVar9 = pthread_rwlock_rdlock((pthread_rwlock_t *)LogDestination::sink_mutex_), iVar9 != 0))
    {
      abort();
    }
    if (LogDestination::sinks_ != (long *)0x0) {
      uVar13 = (ulong)(LogDestination::sinks_[1] - *LogDestination::sinks_) >> 3;
      while( true ) {
        uVar13 = uVar13 - 1;
        if ((int)(uint)uVar13 < 0) break;
        plVar6 = *(long **)(*LogDestination::sinks_ + (ulong)((uint)uVar13 & 0x7fffffff) * 8);
        (**(code **)(*plVar6 + 0x10))
                  (plVar6,(int)cVar1,local_40,local_48,iVar2,&pLVar12->tm_time_,
                   pLVar12->message_text_ + uVar4,~uVar4 + sVar10,iVar3);
      }
    }
  }
  else {
    pLVar12 = this->data_;
    ColoredWriteToStderr((int)pLVar12->severity_,pLVar12->message_text_,pLVar12->num_chars_to_log_);
    pLVar12 = this->data_;
    cVar1 = pLVar12->severity_;
    local_40 = pLVar12->fullname_;
    local_48 = pLVar12->basename_;
    iVar2 = pLVar12->line_;
    iVar3 = pLVar12->usecs_;
    uVar4 = pLVar12->num_prefix_chars_;
    sVar10 = pLVar12->num_chars_to_log_;
    local_50.mu_ = (Mutex *)LogDestination::sink_mutex_;
    if ((LogDestination::sink_mutex_[0x38] == '\x01') &&
       (iVar9 = pthread_rwlock_rdlock((pthread_rwlock_t *)LogDestination::sink_mutex_), iVar9 != 0))
    goto LAB_001142cb;
    if (LogDestination::sinks_ != (long *)0x0) {
      uVar13 = (ulong)(LogDestination::sinks_[1] - *LogDestination::sinks_) >> 3;
      while( true ) {
        uVar13 = uVar13 - 1;
        if ((int)(uint)uVar13 < 0) break;
        plVar6 = *(long **)(*LogDestination::sinks_ + (ulong)((uint)uVar13 & 0x7fffffff) * 8);
        (**(code **)(*plVar6 + 0x10))
                  (plVar6,(int)cVar1,local_40,local_48,iVar2,&pLVar12->tm_time_,
                   pLVar12->message_text_ + uVar4,~uVar4 + sVar10,iVar3);
      }
    }
  }
  ::glog_internal_namespace_::ReaderMutexLock::~ReaderMutexLock(&local_50);
  pLVar7 = local_38;
  if ((local_38->data_->severity_ != '\x03') || (exit_on_dfatal != '\x01')) {
    return;
  }
  if (local_38->data_->first_fatal_ == true) {
    crash_reason._0_8_ = fatal_msg_data_exclusive._30496_8_;
    crash_reason._8_4_ = fatal_msg_data_exclusive._30364_4_;
    crash_reason._16_8_ = fatal_msg_data_exclusive._30464_8_ + 0x135bd4;
    crash_reason._280_4_ = GetStackTrace((void **)(crash_reason + 0x18),0x20,4);
    glog_internal_namespace_::SetCrashReason((CrashReason *)crash_reason);
    iVar2 = (int)pLVar7->data_->num_chars_to_log_;
    iVar9 = 0xff;
    if (iVar2 < 0xff) {
      iVar9 = iVar2;
    }
    memcpy(&fatal_message,pLVar7->data_->message_text_,(long)iVar9);
    (&fatal_message)[iVar9] = 0;
    fatal_time = pLVar7->data_->timestamp_;
  }
  if (fLB::FLAGS_logtostderr == '\0') {
    lVar11 = 0;
    do {
      if ((&LogDestination::log_destinations_)[lVar11] != 0) {
        plVar6 = *(long **)((&LogDestination::log_destinations_)[lVar11] + 0xd8);
        (**(code **)(*plVar6 + 0x10))(plVar6,1,0,"",0);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
  }
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)log_mutex);
  LogDestination::WaitForSinks(pLVar7->data_);
  write(2,"*** Check failure stack trace: ***\n",0x23);
  (*(code *)g_logging_fail_func)();
LAB_001142cb:
  abort();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  static bool already_warned_before_initgoogle = false;

  log_mutex.AssertHeld();

  RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
             data_->message_text_[data_->num_chars_to_log_-1] == '\n', "");

  // Messages of a given severity get logged to lower severity logs, too

  if (!already_warned_before_initgoogle && !IsGoogleLoggingInitialized()) {
    const char w[] = "WARNING: Logging before InitGoogleLogging() is "
                     "written to STDERR\n";
    WriteToStderr(w, strlen(w));
    already_warned_before_initgoogle = true;
  }

  // global flag: never log to file if set.  Also -- don't log to a
  // file if we haven't parsed the command line flags to get the
  // program name.
  if (FLAGS_logtostderr || !IsGoogleLoggingInitialized()) {
    ColoredWriteToStderr(data_->severity_,
                         data_->message_text_, data_->num_chars_to_log_);

    // this could be protected by a flag if necessary.
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_ -
                                data_->num_prefix_chars_ - 1),
                               data_->usecs_);
  } else {

    // log this message to all log files of severity <= severity_
    LogDestination::LogToAllLogfiles(data_->severity_, data_->timestamp_,
                                     data_->message_text_,
                                     data_->num_chars_to_log_);

    LogDestination::MaybeLogToStderr(data_->severity_, data_->message_text_,
                                     data_->num_chars_to_log_);
    LogDestination::MaybeLogToEmail(data_->severity_, data_->message_text_,
                                    data_->num_chars_to_log_);
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_
                                - data_->num_prefix_chars_ - 1),
                               data_->usecs_);
    // NOTE: -1 removes trailing \n
  }

  // If we log a FATAL message, flush all the log destinations, then toss
  // a signal for others to catch. We leave the logs in a state that
  // someone else can use them (as long as they flush afterwards)
  if (data_->severity_ == GLOG_FATAL && exit_on_dfatal) {
    if (data_->first_fatal_) {
      // Store crash information so that it is accessible from within signal
      // handlers that may be invoked later.
      RecordCrashReason(&crash_reason);
      SetCrashReason(&crash_reason);

      // Store shortened fatal message for other logs and GWQ status
      const int copy = min<int>(data_->num_chars_to_log_,
                                sizeof(fatal_message)-1);
      memcpy(fatal_message, data_->message_text_, copy);
      fatal_message[copy] = '\0';
      fatal_time = data_->timestamp_;
    }

    if (!FLAGS_logtostderr) {
      for (int i = 0; i < NUM_SEVERITIES; ++i) {
        if ( LogDestination::log_destinations_[i] )
          LogDestination::log_destinations_[i]->logger_->Write(true, 0, "", 0);
      }
    }

    // release the lock that our caller (directly or indirectly)
    // LogMessage::~LogMessage() grabbed so that signal handlers
    // can use the logging facility. Alternately, we could add
    // an entire unsafe logging interface to bypass locking
    // for signal handlers but this seems simpler.
    log_mutex.Unlock();
    LogDestination::WaitForSinks(data_);

    const char* message = "*** Check failure stack trace: ***\n";
    if (write(STDERR_FILENO, message, strlen(message)) < 0) {
      // Ignore errors.
    }
    Fail();
  }
}